

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::PushColumnClipRect(int column_index)

{
  undefined1 unaff_retaddr;
  ImGuiOldColumnData *column;
  ImGuiOldColumns *columns;
  ImGuiWindow *window;
  int in_stack_ffffffffffffffdc;
  ImVector<ImGuiOldColumnData> *in_stack_ffffffffffffffe0;
  
  GetCurrentWindowRead();
  ImVector<ImGuiOldColumnData>::operator[](in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  PushClipRect((ImVec2 *)columns,(ImVec2 *)column,(bool)unaff_retaddr);
  return;
}

Assistant:

void ImGui::PushColumnClipRect(int column_index)
{
    ImGuiWindow* window = GetCurrentWindowRead();
    ImGuiOldColumns* columns = window->DC.CurrentColumns;
    if (column_index < 0)
        column_index = columns->Current;

    ImGuiOldColumnData* column = &columns->Columns[column_index];
    PushClipRect(column->ClipRect.Min, column->ClipRect.Max, false);
}